

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundCommand.cpp
# Opt level: O3

bool __thiscall senjo::TestCommandHandle::Parse(TestCommandHandle *this,char *params)

{
  string *value;
  byte bVar1;
  size_type sVar2;
  byte *pbVar3;
  bool bVar4;
  int iVar5;
  bool *pbVar6;
  Output *this_00;
  uint uVar7;
  byte *pbVar8;
  byte *pbVar9;
  bool invalid;
  bool local_a1;
  byte *local_a0;
  bool *local_98;
  bool *local_90;
  Output local_88;
  Output local_80;
  long local_78;
  _func_int *local_70 [2];
  byte *local_60;
  uint64_t *local_58;
  int *local_50;
  int *local_48;
  int *local_40;
  int *local_38;
  
  local_a0 = (byte *)params;
  if ((Parse(char_const*)::argCount_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&Parse(char_const*)::argCount_abi_cxx11_), iVar5 != 0)) {
    Parse(char_const*)::argCount_abi_cxx11_._M_dataplus._M_p =
         (pointer)&Parse(char_const*)::argCount_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&Parse(char_const*)::argCount_abi_cxx11_,"count","");
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argCount_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argCount_abi_cxx11_);
  }
  if ((Parse(char_const*)::argDepth_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&Parse(char_const*)::argDepth_abi_cxx11_), iVar5 != 0)) {
    Parse(char_const*)::argDepth_abi_cxx11_._M_dataplus._M_p =
         (pointer)&Parse(char_const*)::argDepth_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&Parse(char_const*)::argDepth_abi_cxx11_,"depth","");
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argDepth_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argDepth_abi_cxx11_);
  }
  if ((Parse(char_const*)::argFile_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&Parse(char_const*)::argFile_abi_cxx11_), iVar5 != 0)) {
    Parse(char_const*)::argFile_abi_cxx11_._M_dataplus._M_p =
         (pointer)&Parse(char_const*)::argFile_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&Parse(char_const*)::argFile_abi_cxx11_,"file","");
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argFile_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&Parse(char_const*)::argFile_abi_cxx11_);
  }
  if ((Parse(char_const*)::argGain_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&Parse(char_const*)::argGain_abi_cxx11_), iVar5 != 0)) {
    Parse(char_const*)::argGain_abi_cxx11_._M_dataplus._M_p =
         (pointer)&Parse(char_const*)::argGain_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&Parse(char_const*)::argGain_abi_cxx11_,"gain","");
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argGain_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&Parse(char_const*)::argGain_abi_cxx11_);
  }
  if ((Parse(char_const*)::argNoClear_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&Parse(char_const*)::argNoClear_abi_cxx11_), iVar5 != 0)) {
    Parse(char_const*)::argNoClear_abi_cxx11_._M_dataplus._M_p =
         (pointer)&Parse(char_const*)::argNoClear_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&Parse(char_const*)::argNoClear_abi_cxx11_,"noclear","");
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argNoClear_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argNoClear_abi_cxx11_);
  }
  if ((Parse(char_const*)::argPrint_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&Parse(char_const*)::argPrint_abi_cxx11_), iVar5 != 0)) {
    Parse(char_const*)::argPrint_abi_cxx11_._M_dataplus._M_p =
         (pointer)&Parse(char_const*)::argPrint_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&Parse(char_const*)::argPrint_abi_cxx11_,"print","");
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argPrint_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argPrint_abi_cxx11_);
  }
  if ((Parse(char_const*)::argSkip_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&Parse(char_const*)::argSkip_abi_cxx11_), iVar5 != 0)) {
    Parse(char_const*)::argSkip_abi_cxx11_._M_dataplus._M_p =
         (pointer)&Parse(char_const*)::argSkip_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&Parse(char_const*)::argSkip_abi_cxx11_,"skip","");
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argSkip_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&Parse(char_const*)::argSkip_abi_cxx11_);
  }
  if ((Parse(char_const*)::argTime_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&Parse(char_const*)::argTime_abi_cxx11_), iVar5 != 0)) {
    Parse(char_const*)::argTime_abi_cxx11_._M_dataplus._M_p =
         (pointer)&Parse(char_const*)::argTime_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&Parse(char_const*)::argTime_abi_cxx11_,"time","");
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argTime_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&Parse(char_const*)::argTime_abi_cxx11_);
  }
  this->noClear = false;
  this->printBoard = false;
  this->maxTime = 0;
  value = &this->fileName;
  this->maxCount = 0;
  this->maxDepth = 0;
  this->minGain = 0;
  this->skipCount = 0;
  std::__cxx11::string::_M_replace
            ((ulong)value,0,(char *)(this->fileName)._M_string_length,0x1499eb);
  local_a1 = false;
  if (local_a0 != (byte *)0x0) {
    local_90 = &this->noClear;
    local_98 = &this->printBoard;
    local_38 = &this->maxCount;
    local_40 = &this->maxDepth;
    local_48 = &this->minGain;
    local_50 = &this->skipCount;
    local_58 = &this->maxTime;
    do {
      bVar1 = *local_a0;
      pbVar9 = local_a0;
      pbVar8 = local_a0;
      while( true ) {
        local_a0 = pbVar9;
        if (bVar1 == 0) goto LAB_00142880;
        pbVar8 = pbVar8 + 1;
        iVar5 = isspace((int)(char)bVar1);
        sVar2 = Parse(char_const*)::argNoClear_abi_cxx11_._M_string_length;
        if (iVar5 == 0) break;
        bVar1 = pbVar9[1];
        pbVar9 = pbVar9 + 1;
      }
      if ((Parse(char_const*)::argNoClear_abi_cxx11_._M_string_length == 0) ||
         (iVar5 = strncmp((char *)pbVar9,Parse(char_const*)::argNoClear_abi_cxx11_._M_dataplus._M_p,
                          Parse(char_const*)::argNoClear_abi_cxx11_._M_string_length), iVar5 != 0))
      {
LAB_0014262f:
        sVar2 = Parse(char_const*)::argPrint_abi_cxx11_._M_string_length;
        if ((Parse(char_const*)::argPrint_abi_cxx11_._M_string_length != 0) &&
           (iVar5 = strncmp((char *)pbVar9,Parse(char_const*)::argPrint_abi_cxx11_._M_dataplus._M_p,
                            Parse(char_const*)::argPrint_abi_cxx11_._M_string_length), iVar5 == 0))
        {
          uVar7 = (uint)(char)pbVar9[sVar2];
          pbVar6 = local_98;
          pbVar3 = pbVar9 + sVar2;
          if (uVar7 != 0) {
            iVar5 = isspace(uVar7);
            if (iVar5 == 0) goto LAB_00142655;
            pbVar8 = pbVar8 + sVar2;
            local_a0 = pbVar9 + sVar2;
            do {
              pbVar9 = pbVar8;
              iVar5 = isspace((int)(char)uVar7);
              pbVar6 = local_98;
              pbVar3 = local_a0;
              if (iVar5 == 0) break;
              uVar7 = (uint)*pbVar9;
              pbVar8 = pbVar9 + 1;
              local_a0 = pbVar9;
              pbVar3 = pbVar9;
            } while (*pbVar9 != 0);
          }
          goto LAB_001427f7;
        }
LAB_00142655:
        bVar4 = NumberParam<int>((senjo *)Parse(char_const*)::argCount_abi_cxx11_._M_dataplus._M_p,
                                 (string *)Parse(char_const*)::argCount_abi_cxx11_._M_string_length,
                                 local_38,(char **)&local_a0,&local_a1);
        if (((((!bVar4) &&
              (bVar4 = NumberParam<int>((senjo *)Parse(char_const*)::argDepth_abi_cxx11_._M_dataplus
                                                 ._M_p,
                                        (string *)
                                        Parse(char_const*)::argDepth_abi_cxx11_._M_string_length,
                                        local_40,(char **)&local_a0,&local_a1), !bVar4)) &&
             (bVar4 = NumberParam<int>((senjo *)Parse(char_const*)::argGain_abi_cxx11_._M_dataplus.
                                                _M_p,
                                       (string *)
                                       Parse(char_const*)::argGain_abi_cxx11_._M_string_length,
                                       local_48,(char **)&local_a0,&local_a1), !bVar4)) &&
            ((bVar4 = NumberParam<int>((senjo *)Parse(char_const*)::argSkip_abi_cxx11_._M_dataplus.
                                                _M_p,
                                       (string *)
                                       Parse(char_const*)::argSkip_abi_cxx11_._M_string_length,
                                       local_50,(char **)&local_a0,&local_a1), !bVar4 &&
             (bVar4 = NumberParam<unsigned_long>
                                ((senjo *)Parse(char_const*)::argTime_abi_cxx11_._M_dataplus._M_p,
                                 (string *)Parse(char_const*)::argTime_abi_cxx11_._M_string_length,
                                 local_58,(char **)&local_a0,&local_a1), !bVar4)))) &&
           (bVar4 = StringParam((senjo *)Parse(char_const*)::argFile_abi_cxx11_._M_dataplus._M_p,
                                (string *)Parse(char_const*)::argFile_abi_cxx11_._M_string_length,
                                value,(char **)&local_a0,&local_a1), !bVar4)) {
          Output::Output(&local_80,InfoPrefix);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Unexpected token: ",0x12);
          Output::operator<<(&local_80,(char **)&local_a0);
          this_00 = &local_80;
          goto LAB_00142877;
        }
      }
      else {
        uVar7 = (uint)(char)pbVar9[sVar2];
        pbVar6 = local_90;
        pbVar3 = pbVar9 + sVar2;
        if (uVar7 != 0) {
          local_60 = pbVar9 + sVar2;
          iVar5 = isspace(uVar7);
          if (iVar5 == 0) goto LAB_0014262f;
          local_a0 = local_60;
          pbVar9 = pbVar8 + sVar2;
          do {
            pbVar8 = pbVar9;
            iVar5 = isspace((int)(char)uVar7);
            pbVar6 = local_90;
            pbVar3 = local_a0;
            if (iVar5 == 0) break;
            uVar7 = (uint)*pbVar8;
            pbVar9 = pbVar8 + 1;
            local_a0 = pbVar8;
            pbVar3 = pbVar8;
          } while (*pbVar8 != 0);
        }
LAB_001427f7:
        local_a0 = pbVar3;
        *pbVar6 = true;
      }
    } while ((local_a1 == false) && (local_a0 != (byte *)0x0));
    if (local_a1 != false) {
      Output::Output(&local_88,InfoPrefix);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"usage: ",7);
      (*(this->super_BackgroundCommand)._vptr_BackgroundCommand[3])(&local_80,this);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)local_80._vptr_Output,local_78);
      if (local_80._vptr_Output != local_70) {
        operator_delete(local_80._vptr_Output);
      }
      this_00 = &local_88;
LAB_00142877:
      Output::~Output(this_00);
      return false;
    }
  }
LAB_00142880:
  if ((this->fileName)._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)value);
  }
  return true;
}

Assistant:

bool TestCommandHandle::Parse(const char* params)
{
  static const std::string argCount   = "count";
  static const std::string argDepth   = "depth";
  static const std::string argFile    = "file";
  static const std::string argGain    = "gain";
  static const std::string argNoClear = "noclear";
  static const std::string argPrint   = "print";
  static const std::string argSkip    = "skip";
  static const std::string argTime    = "time";

  noClear    = false;
  printBoard = false;
  maxCount   = 0;
  maxDepth   = 0;
  minGain    = 0;
  skipCount  = 0;
  maxTime    = 0;
  fileName   = "";

  bool invalid = false;
  while (!invalid && params && *NextWord(params)) {
    if (HasParam(argNoClear,  noClear,    params) ||
        HasParam(argPrint,    printBoard, params) ||
        NumberParam(argCount, maxCount,   params, invalid) ||
        NumberParam(argDepth, maxDepth,   params, invalid) ||
        NumberParam(argGain,  minGain,    params, invalid) ||
        NumberParam(argSkip,  skipCount,  params, invalid) ||
        NumberParam(argTime,  maxTime,    params, invalid) ||
        StringParam(argFile,  fileName,   params, invalid))
    {
      continue;
    }
    Output() << "Unexpected token: " << params;
    return false;
  }
  if (invalid) {
    Output() << "usage: " << Usage();
    return false;
  }

  if (fileName.empty()) {
    fileName = _TEST_FILE;
  }

  return true;
}